

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a,Integer g_b,Integer trans)

{
  long lVar1;
  size_t __size;
  C_Integer *pCVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  Integer IVar14;
  Integer IVar15;
  Integer g_a;
  Integer *mapc;
  void *pvVar16;
  logical lVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  long lVar20;
  Integer IVar21;
  int *piVar22;
  long lVar23;
  long *plVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  long *plVar28;
  float *pfVar29;
  long lVar30;
  undefined8 *puVar31;
  long lVar32;
  double *pdVar33;
  float *pfVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  _sparse_array *p_Var41;
  long lVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  void *data_c;
  Integer tlo_c [2];
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_a;
  Integer jhi_a;
  Integer jlo_a;
  void *jptr_a;
  void *iptr_a;
  Integer ld_b [2];
  undefined1 (*local_1e8) [16];
  long local_1b0;
  undefined1 (*local_198) [16];
  long local_190;
  long local_188;
  long local_180;
  long local_170;
  long local_168;
  long local_160;
  Integer local_158;
  Integer local_150;
  long local_140;
  undefined1 (*local_138) [16];
  Integer local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0 [2];
  Integer local_e0;
  Integer local_d8;
  long local_d0;
  long local_c8;
  Integer local_c0;
  Integer local_b8;
  Integer local_b0;
  long local_a8;
  Integer local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  Integer local_48;
  Integer local_40;
  
  lVar1 = s_a + 1000;
  lVar40 = g_b + 1000;
  lVar25 = lVar1 * 200;
  local_c0 = s_a;
  local_a0 = g_b;
  local_e0 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  IVar15 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  lVar37 = (long)_ga_sync_begin;
  local_140 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (lVar37 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  if (SPA[lVar1].type != (long)GA[lVar40].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices A and B must match",0);
  }
  local_130 = SPA[lVar1].type;
  if (SPA[lVar1].grp != (long)GA[lVar40].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar40].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be of dimension 2",
               (long)GA[lVar40].ndim);
  }
  if (trans == 0) {
    lVar18 = GA[lVar40].dims[0];
  }
  else {
    lVar18 = GA[lVar40].dims[1];
  }
  if (SPA[lVar1].jdim != lVar18) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of A must match row dimension of B"
               ,0);
  }
  pCVar2 = GA->dims + 1;
  if (trans != 0) {
    pCVar2 = GA->dims;
  }
  local_d8 = pCVar2[lVar40 * 0x6d];
  IVar21 = SPA[lVar1].idim;
  IVar14 = local_d8;
  if (trans == 0) {
    IVar21 = local_d8;
    IVar14 = SPA[lVar1].idim;
  }
  pnga_mask_sync(lVar37,local_140);
  g_a = pnga_create_handle();
  local_48 = IVar14;
  local_40 = IVar21;
  pnga_set_data(g_a,2,&local_48,local_130);
  IVar14 = local_e0;
  __size = local_e0 * 8;
  mapc = (Integer *)malloc(local_e0 * 8 + 8);
  pvVar16 = malloc(__size);
  if (0 < IVar14) {
    memset(pvVar16,0,__size);
  }
  p_Var41 = SPA;
  *(Integer *)((long)pvVar16 + IVar15 * 8) = (SPA[lVar1].ihi - SPA[lVar1].ilo) + 1;
  pnga_pgroup_gop(p_Var41[lVar1].grp,0x3ea,pvVar16,IVar14,"+");
  lVar40 = local_140;
  *mapc = 1;
  if (trans == 0) {
    if (1 < IVar14) {
      lVar18 = 1;
      lVar20 = 0;
      do {
        lVar18 = lVar18 + *(long *)((long)pvVar16 + lVar20 * 8);
        mapc[lVar20 + 1] = lVar18;
        lVar20 = lVar20 + 1;
      } while (IVar14 + -1 != lVar20);
    }
    mapc[IVar14] = 1;
    local_58 = IVar14;
    local_50 = 1;
  }
  else {
    mapc[1] = 1;
    local_58 = 1;
    local_50 = IVar14;
    if (1 < IVar14) {
      lVar18 = 1;
      lVar20 = 1;
      do {
        lVar18 = lVar18 + *(long *)((long)pvVar16 + lVar20 * 8 + -8);
        mapc[lVar20 + 1] = lVar18;
        lVar20 = lVar20 + 1;
      } while (IVar14 != lVar20);
    }
  }
  pnga_set_irreg_distr(g_a,mapc,&local_58);
  pnga_set_pgroup(g_a,SPA[lVar1].grp);
  pnga_mask_sync(lVar37,lVar40);
  lVar17 = pnga_allocate(g_a);
  if (lVar17 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_mask_sync(lVar37,lVar40);
  pnga_zero(g_a);
  if (0 < IVar14) {
    IVar15 = 0;
    p_Var41 = SPA;
    local_b0 = g_a;
    local_a8 = lVar25;
    do {
      local_f8 = *(long *)((long)&p_Var41->ilo + lVar25) + 1;
      local_108 = *(long *)((long)&p_Var41->ihi + lVar25) + 1;
      pnga_sprs_array_column_distribution(local_c0,IVar15,local_f0,&local_100);
      lVar37 = local_f8;
      lVar1 = local_108;
      local_f0[0] = local_f0[0] + 1;
      local_100 = local_100 + 1;
      if (trans == 0) {
        local_128 = local_f8;
        local_118 = local_108;
        local_110 = local_100;
        local_120 = local_f0[0];
      }
      else {
        local_120 = local_f8;
        local_110 = local_108;
        local_128 = local_f0[0];
        local_118 = local_100;
      }
      local_b8 = IVar15;
      if (0 < *(long *)((long)&p_Var41->nblocks + lVar25)) {
        lVar40 = local_f8 + -1;
        lVar18 = 0;
        local_d0 = local_100;
        local_c8 = local_f0[0];
        do {
          IVar15 = *(Integer *)(*(long *)((long)&p_Var41->blkidx + lVar25) + lVar18 * 8);
          if (trans == 0) {
            local_158 = (local_118 - local_128) + 1;
            local_150 = local_d8;
          }
          else {
            local_158 = local_d8;
            local_150 = (local_110 - local_120) + 1;
          }
          local_98 = lVar18;
          pnga_access_ptr(g_a,&local_128,&local_118,&local_198,&local_158);
          IVar14 = local_c0;
          pnga_sprs_array_column_distribution(local_c0,IVar15,&local_80,&local_88);
          pnga_sprs_array_access_col_block(IVar14,IVar15,&local_70,&local_78,&local_90);
          lVar18 = local_80;
          local_188 = local_80 + 1;
          local_168 = local_88 + 1;
          local_180 = local_c8;
          local_160 = local_d0;
          if (trans != 0) {
            local_180 = local_188;
            local_188 = local_c8;
            local_160 = local_168;
            local_168 = local_d0;
          }
          lVar42 = (local_168 - local_188) + 1;
          lVar20 = (local_160 - local_180) + 1;
          pvVar16 = malloc(lVar20 * lVar42 * *(long *)((long)&SPA->size + lVar25));
          local_68 = lVar42;
          local_60 = lVar20;
          pnga_get(local_a0,&local_188,&local_168,pvVar16,&local_68);
          if (*(long *)((long)&SPA->idx_size + lVar25) == 4) {
            switch(local_130) {
            case 0x3e9:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_170 = 0;
                lVar25 = lVar40;
                do {
                  lVar42 = lVar25 - lVar40;
                  lVar36 = (long)*(int *)(local_70 + 4 + lVar42 * 4) -
                           (long)*(int *)(local_70 + lVar42 * 4);
                  if (0 < (int)lVar36) {
                    lVar32 = 0;
                    do {
                      lVar38 = *(int *)(local_78 + lVar32 * 4 +
                                       (long)*(int *)(local_70 + lVar42 * 4) * 4) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          piVar26 = (int *)((long)pvVar16 + lVar38 * 4);
                          lVar38 = lVar20;
                          piVar22 = (int *)(*local_198 + local_170);
                          do {
                            *piVar22 = *piVar22 +
                                       *piVar26 *
                                       *(int *)(local_90 + lVar32 * 4 +
                                               (long)*(int *)(local_70 + lVar42 * 4) * 4);
                            piVar22 = piVar22 + local_158;
                            piVar26 = piVar26 + lVar20;
                            lVar38 = lVar38 + -1;
                          } while (lVar38 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar30 = 0;
                        do {
                          *(int *)(*local_198 + lVar30 * 4 + local_158 * local_170) =
                               *(int *)(*local_198 + lVar30 * 4 + local_158 * local_170) +
                               *(int *)((long)pvVar16 + lVar30 * 4 + lVar38 * lVar20 * 4) *
                               *(int *)(local_90 + lVar32 * 4 +
                                       (long)*(int *)(local_70 + lVar42 * 4) * 4);
                          lVar30 = lVar30 + 1;
                        } while (lVar20 != lVar30);
                      }
                      lVar32 = lVar32 + 1;
                    } while (lVar32 != lVar36);
                  }
                  lVar25 = lVar25 + 1;
                  local_170 = local_170 + 4;
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ea:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                lVar42 = 0;
                lVar25 = lVar40;
                do {
                  lVar36 = lVar25 - lVar40;
                  lVar38 = (long)*(int *)(local_70 + lVar36 * 4);
                  lVar32 = *(int *)(local_70 + 4 + lVar36 * 4) - lVar38;
                  if (0 < (int)lVar32) {
                    lVar30 = local_90 + lVar38 * 8;
                    lVar23 = 0;
                    do {
                      lVar27 = *(int *)(local_78 + lVar38 * 4 + lVar23 * 4) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          lVar39 = local_188;
                          do {
                            plVar28 = (long *)((long)local_198 +
                                              (lVar39 - local_188) * local_158 * 8 + lVar36 * 8);
                            *plVar28 = *plVar28 +
                                       *(long *)((long)pvVar16 +
                                                (lVar39 - local_188) * lVar20 * 8 + lVar27 * 8) *
                                       *(long *)(lVar30 + lVar23 * 8);
                            bVar6 = lVar39 < local_168;
                            lVar39 = lVar39 + 1;
                          } while (bVar6);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar39 = local_188 + -1;
                        do {
                          plVar28 = (long *)((long)local_198 +
                                            lVar39 * 8 + local_158 * lVar42 + local_188 * -8 + 8);
                          *plVar28 = *plVar28 +
                                     *(long *)((long)pvVar16 +
                                              lVar39 * 8 + local_188 * -8 + lVar27 * lVar20 * 8 + 8)
                                     * *(long *)(lVar30 + lVar23 * 8);
                          lVar39 = lVar39 + 1;
                        } while (lVar39 < local_168);
                      }
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != lVar32);
                  }
                  lVar25 = lVar25 + 1;
                  lVar42 = lVar42 + 8;
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3eb:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1e8 = (undefined1 (*) [16])0x0;
                lVar25 = lVar40;
                do {
                  lVar42 = (long)*(int *)(local_70 + (lVar25 - lVar40) * 4);
                  lVar36 = *(int *)(local_70 + 4 + (lVar25 - lVar40) * 4) - lVar42;
                  if (0 < (int)lVar36) {
                    lVar32 = local_90 + lVar42 * 4;
                    lVar38 = 0;
                    do {
                      lVar30 = *(int *)(local_78 + lVar42 * 4 + lVar38 * 4) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pfVar29 = (float *)((long)pvVar16 + lVar30 * 4);
                          lVar30 = lVar20;
                          pfVar34 = (float *)(*local_198 + (long)local_1e8);
                          do {
                            *pfVar34 = *(float *)(lVar32 + lVar38 * 4) * *pfVar29 + *pfVar34;
                            pfVar34 = pfVar34 + local_158;
                            pfVar29 = pfVar29 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(float *)(*local_198 + lVar23 * 4 + local_158 * (long)local_1e8) =
                               *(float *)(lVar32 + lVar38 * 4) *
                               *(float *)((long)pvVar16 + lVar23 * 4 + lVar30 * lVar20 * 4) +
                               *(float *)(*local_198 + lVar23 * 4 + local_158 * (long)local_1e8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e8 = (undefined1 (*) [16])((long)local_1e8 + 4);
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ec:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1e8 = (undefined1 (*) [16])0x0;
                lVar25 = lVar40;
                do {
                  lVar42 = (long)*(int *)(local_70 + (lVar25 - lVar40) * 4);
                  lVar36 = *(int *)(local_70 + 4 + (lVar25 - lVar40) * 4) - lVar42;
                  if (0 < (int)lVar36) {
                    lVar32 = local_90 + lVar42 * 8;
                    lVar38 = 0;
                    do {
                      lVar30 = *(int *)(local_78 + lVar42 * 4 + lVar38 * 4) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pdVar33 = (double *)((long)pvVar16 + lVar30 * 8);
                          lVar30 = lVar20;
                          pdVar35 = (double *)(*local_198 + (long)local_1e8);
                          do {
                            *pdVar35 = *(double *)(lVar32 + lVar38 * 8) * *pdVar33 + *pdVar35;
                            pdVar35 = pdVar35 + local_158;
                            pdVar33 = pdVar33 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(double *)(*local_198 + lVar23 * 8 + local_158 * (long)local_1e8) =
                               *(double *)(lVar32 + lVar38 * 8) *
                               *(double *)((long)pvVar16 + lVar23 * 8 + lVar30 * lVar20 * 8) +
                               *(double *)(*local_198 + lVar23 * 8 + local_158 * (long)local_1e8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e8 = (undefined1 (*) [16])((long)local_1e8 + 8);
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ee:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_190 = 0;
                lVar25 = lVar40;
                do {
                  local_170 = lVar25;
                  lVar42 = (long)*(int *)(local_70 + (local_170 - lVar40) * 4);
                  lVar25 = *(int *)(local_70 + 4 + (local_170 - lVar40) * 4) - lVar42;
                  if (0 < (int)lVar25) {
                    lVar36 = 0;
                    do {
                      lVar32 = (long)*(int *)(local_78 + lVar42 * 4 + lVar36 * 4);
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pfVar29 = (float *)((long)pvVar16 + lVar32 * 8 + lVar18 * -8 + 4);
                          puVar31 = (undefined8 *)(*local_198 + local_190);
                          lVar32 = lVar20;
                          do {
                            uVar5 = *(undefined8 *)(local_90 + (lVar36 + lVar42) * 8);
                            fVar44 = (float)uVar5;
                            fVar46 = (float)((ulong)uVar5 >> 0x20);
                            *puVar31 = CONCAT44((float)((ulong)*puVar31 >> 0x20) +
                                                pfVar29[-1] * fVar46 + fVar44 * *pfVar29,
                                                (float)*puVar31 +
                                                pfVar29[-1] * fVar44 + -fVar46 * *pfVar29);
                            puVar31 = puVar31 + local_158;
                            pfVar29 = pfVar29 + lVar20 * 2;
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar38 = (lVar32 - lVar18) * lVar20 * 8;
                        lVar32 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_90 + (lVar42 + lVar36) * 8);
                          fVar43 = (float)uVar5;
                          fVar45 = (float)((ulong)uVar5 >> 0x20);
                          fVar44 = *(float *)((long)pvVar16 + lVar32 * 8 + lVar38);
                          fVar46 = *(float *)((long)pvVar16 + lVar32 * 8 + lVar38 + 4);
                          *(ulong *)(*local_198 + lVar32 * 8 + local_158 * local_190) =
                               CONCAT44((float)((ulong)*(undefined8 *)
                                                        (*local_198 +
                                                        lVar32 * 8 + local_158 * local_190) >> 0x20)
                                        + fVar44 * fVar45 + fVar43 * fVar46,
                                        (float)*(undefined8 *)
                                                (*local_198 + lVar32 * 8 + local_158 * local_190) +
                                        fVar44 * fVar43 + -fVar45 * fVar46);
                          lVar32 = lVar32 + 1;
                        } while (lVar20 != lVar32);
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != lVar25);
                  }
                  local_190 = local_190 + 8;
                  lVar25 = local_170 + 1;
                } while (local_170 + 1 != lVar1);
              }
              break;
            case 0x3ef:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_138 = local_198;
                local_1e8 = local_198;
                local_190 = 0;
                lVar25 = lVar40;
                do {
                  local_170 = lVar25;
                  lVar25 = (long)*(int *)(local_70 + (local_170 - lVar40) * 4);
                  lVar42 = *(int *)(local_70 + 4 + (local_170 - lVar40) * 4) - lVar25;
                  if (0 < (int)lVar42) {
                    lVar36 = 0;
                    do {
                      lVar32 = (long)*(int *)(local_78 + lVar25 * 4 + lVar36 * 4);
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pdVar33 = (double *)((long)pvVar16 + lVar32 * 0x10 + lVar18 * -0x10 + 8);
                          pauVar19 = local_1e8;
                          lVar32 = lVar20;
                          do {
                            pdVar35 = (double *)(local_90 + (lVar36 + lVar25) * 0x10);
                            dVar4 = *pdVar35;
                            dVar11 = pdVar35[1];
                            dVar3 = *(double *)(*pauVar19 + 8) +
                                    pdVar33[-1] * dVar11 + dVar4 * *pdVar33;
                            auVar8._8_4_ = SUB84(dVar3,0);
                            auVar8._0_8_ = *(double *)*pauVar19 +
                                           pdVar33[-1] * dVar4 + -dVar11 * *pdVar33;
                            auVar8._12_4_ = (int)((ulong)dVar3 >> 0x20);
                            *pauVar19 = auVar8;
                            pauVar19 = pauVar19 + local_158;
                            pdVar33 = pdVar33 + lVar20 * 2;
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar30 = (lVar32 - lVar18) * lVar20 * 0x10;
                        lVar38 = 0;
                        lVar32 = lVar20;
                        do {
                          pdVar33 = (double *)(local_90 + (lVar36 + lVar25) * 0x10);
                          dVar12 = *pdVar33;
                          dVar13 = pdVar33[1];
                          dVar3 = *(double *)((long)pvVar16 + lVar38 + lVar30);
                          dVar4 = *(double *)((long)pvVar16 + lVar38 + lVar30 + 8);
                          dVar11 = *(double *)
                                    ((long)(*local_198 + lVar38 + local_158 * local_190) + 8) +
                                   dVar3 * dVar13 + dVar12 * dVar4;
                          auVar7._8_4_ = SUB84(dVar11,0);
                          auVar7._0_8_ = *(double *)(*local_198 + lVar38 + local_158 * local_190) +
                                         dVar3 * dVar12 + -dVar13 * dVar4;
                          auVar7._12_4_ = (int)((ulong)dVar11 >> 0x20);
                          *(undefined1 (*) [16])(*local_198 + lVar38 + local_158 * local_190) =
                               auVar7;
                          lVar38 = lVar38 + 0x10;
                          lVar32 = lVar32 + -1;
                        } while (lVar32 != 0);
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != lVar42);
                  }
                  local_190 = local_190 + 0x10;
                  local_1e8 = local_1e8 + 1;
                  lVar25 = local_170 + 1;
                } while (local_170 + 1 != lVar1);
              }
              break;
            case 0x3f8:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1b0 = 0;
                lVar25 = lVar40;
                do {
                  lVar42 = (long)*(int *)(local_70 + (lVar25 - lVar40) * 4);
                  lVar36 = *(int *)(local_70 + 4 + (lVar25 - lVar40) * 4) - lVar42;
                  if (0 < (int)lVar36) {
                    lVar32 = local_90 + lVar42 * 8;
                    lVar38 = 0;
                    do {
                      lVar30 = *(int *)(local_78 + lVar42 * 4 + lVar38 * 4) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          plVar28 = (long *)((long)pvVar16 + lVar30 * 8);
                          plVar24 = (long *)(*local_198 + local_1b0);
                          lVar30 = lVar20;
                          do {
                            *plVar24 = *plVar24 + *plVar28 * *(long *)(lVar32 + lVar38 * 8);
                            plVar24 = plVar24 + local_158;
                            plVar28 = plVar28 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(long *)(*local_198 + lVar23 * 8 + local_158 * local_1b0) =
                               *(long *)(*local_198 + lVar23 * 8 + local_158 * local_1b0) +
                               *(long *)((long)pvVar16 + lVar23 * 8 + lVar30 * lVar20 * 8) *
                               *(long *)(lVar32 + lVar38 * 8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 8;
                } while (lVar25 != lVar1);
              }
            }
          }
          else {
            switch(local_130) {
            case 0x3e9:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1b0 = 0;
                lVar25 = lVar40;
                do {
                  lVar42 = *(long *)(local_70 + (lVar25 - lVar40) * 8);
                  lVar36 = *(long *)(local_70 + 8 + (lVar25 - lVar40) * 8);
                  if (lVar42 < lVar36) {
                    lVar32 = local_90 + lVar42 * 4;
                    lVar38 = 0;
                    do {
                      lVar30 = *(long *)(local_78 + lVar42 * 8 + lVar38 * 8) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          piVar26 = (int *)((long)pvVar16 + lVar30 * 4);
                          piVar22 = (int *)(*local_198 + local_1b0);
                          lVar30 = lVar20;
                          do {
                            *piVar22 = *piVar22 + *piVar26 * *(int *)(lVar32 + lVar38 * 4);
                            piVar22 = piVar22 + local_158;
                            piVar26 = piVar26 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(int *)(*local_198 + lVar23 * 4 + local_158 * local_1b0) =
                               *(int *)(*local_198 + lVar23 * 4 + local_158 * local_1b0) +
                               *(int *)((long)pvVar16 + lVar23 * 4 + lVar30 * lVar20 * 4) *
                               *(int *)(lVar32 + lVar38 * 4);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36 - lVar42);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 4;
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ea:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                lVar42 = 0;
                lVar25 = lVar40;
                do {
                  lVar38 = lVar25 - lVar40;
                  lVar36 = *(long *)(local_70 + 8 + lVar38 * 8);
                  lVar32 = *(long *)(local_70 + lVar38 * 8);
                  if (lVar32 < lVar36) {
                    lVar30 = 0;
                    do {
                      lVar27 = *(long *)(local_78 + *(long *)(local_70 + lVar38 * 8) * 8 +
                                        lVar30 * 8) - lVar18;
                      lVar23 = local_90 + lVar30 * 8;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          lVar39 = local_188;
                          do {
                            plVar28 = (long *)((long)local_198 +
                                              (lVar39 - local_188) * local_158 * 8 + lVar38 * 8);
                            *plVar28 = *plVar28 +
                                       *(long *)((long)pvVar16 +
                                                (lVar39 - local_188) * lVar20 * 8 + lVar27 * 8) *
                                       *(long *)(lVar23 + *(long *)(local_70 + lVar38 * 8) * 8);
                            bVar6 = lVar39 < local_168;
                            lVar39 = lVar39 + 1;
                          } while (bVar6);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar39 = local_188 + -1;
                        do {
                          plVar28 = (long *)((long)local_198 +
                                            lVar39 * 8 + local_158 * lVar42 + local_188 * -8 + 8);
                          *plVar28 = *plVar28 +
                                     *(long *)((long)pvVar16 +
                                              lVar39 * 8 + local_188 * -8 + lVar27 * lVar20 * 8 + 8)
                                     * *(long *)(lVar23 + *(long *)(local_70 + lVar38 * 8) * 8);
                          lVar39 = lVar39 + 1;
                        } while (lVar39 < local_168);
                      }
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != lVar36 - lVar32);
                  }
                  lVar25 = lVar25 + 1;
                  lVar42 = lVar42 + 8;
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3eb:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1e8 = (undefined1 (*) [16])0x0;
                lVar25 = lVar40;
                do {
                  lVar42 = *(long *)(local_70 + (lVar25 - lVar40) * 8);
                  lVar36 = *(long *)(local_70 + 8 + (lVar25 - lVar40) * 8);
                  if (lVar42 < lVar36) {
                    lVar32 = local_90 + lVar42 * 4;
                    lVar38 = 0;
                    do {
                      lVar30 = *(long *)(local_78 + lVar42 * 8 + lVar38 * 8) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pfVar29 = (float *)((long)pvVar16 + lVar30 * 4);
                          lVar30 = lVar20;
                          pfVar34 = (float *)(*local_198 + (long)local_1e8);
                          do {
                            *pfVar34 = *(float *)(lVar32 + lVar38 * 4) * *pfVar29 + *pfVar34;
                            pfVar34 = pfVar34 + local_158;
                            pfVar29 = pfVar29 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(float *)(*local_198 + lVar23 * 4 + local_158 * (long)local_1e8) =
                               *(float *)(lVar32 + lVar38 * 4) *
                               *(float *)((long)pvVar16 + lVar23 * 4 + lVar30 * lVar20 * 4) +
                               *(float *)(*local_198 + lVar23 * 4 + local_158 * (long)local_1e8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36 - lVar42);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e8 = (undefined1 (*) [16])((long)local_1e8 + 4);
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ec:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1e8 = (undefined1 (*) [16])0x0;
                lVar25 = lVar40;
                do {
                  lVar42 = *(long *)(local_70 + (lVar25 - lVar40) * 8);
                  lVar36 = *(long *)(local_70 + 8 + (lVar25 - lVar40) * 8);
                  if (lVar42 < lVar36) {
                    lVar32 = local_90 + lVar42 * 8;
                    lVar38 = 0;
                    do {
                      lVar30 = *(long *)(local_78 + lVar42 * 8 + lVar38 * 8) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pdVar33 = (double *)((long)pvVar16 + lVar30 * 8);
                          lVar30 = lVar20;
                          pdVar35 = (double *)(*local_198 + (long)local_1e8);
                          do {
                            *pdVar35 = *(double *)(lVar32 + lVar38 * 8) * *pdVar33 + *pdVar35;
                            pdVar35 = pdVar35 + local_158;
                            pdVar33 = pdVar33 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(double *)(*local_198 + lVar23 * 8 + local_158 * (long)local_1e8) =
                               *(double *)(lVar32 + lVar38 * 8) *
                               *(double *)((long)pvVar16 + lVar23 * 8 + lVar30 * lVar20 * 8) +
                               *(double *)(*local_198 + lVar23 * 8 + local_158 * (long)local_1e8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36 - lVar42);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e8 = (undefined1 (*) [16])((long)local_1e8 + 8);
                } while (lVar25 != lVar1);
              }
              break;
            case 0x3ee:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_190 = 0;
                lVar25 = lVar40;
                do {
                  local_170 = lVar25;
                  lVar25 = *(long *)(local_70 + (local_170 - lVar40) * 8);
                  lVar42 = *(long *)(local_70 + 8 + (local_170 - lVar40) * 8);
                  if (lVar25 < lVar42) {
                    lVar36 = 0;
                    do {
                      lVar32 = *(long *)(local_78 + lVar25 * 8 + lVar36 * 8);
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pfVar29 = (float *)((long)pvVar16 + lVar32 * 8 + lVar18 * -8 + 4);
                          puVar31 = (undefined8 *)(*local_198 + local_190);
                          lVar32 = lVar20;
                          do {
                            uVar5 = *(undefined8 *)(local_90 + (lVar25 + lVar36) * 8);
                            fVar44 = (float)uVar5;
                            fVar46 = (float)((ulong)uVar5 >> 0x20);
                            *puVar31 = CONCAT44((float)((ulong)*puVar31 >> 0x20) +
                                                pfVar29[-1] * fVar46 + fVar44 * *pfVar29,
                                                (float)*puVar31 +
                                                pfVar29[-1] * fVar44 + -fVar46 * *pfVar29);
                            puVar31 = puVar31 + local_158;
                            pfVar29 = pfVar29 + lVar20 * 2;
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar38 = (lVar32 - lVar18) * lVar20 * 8;
                        lVar32 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_90 + (lVar25 + lVar36) * 8);
                          fVar43 = (float)uVar5;
                          fVar45 = (float)((ulong)uVar5 >> 0x20);
                          fVar44 = *(float *)((long)pvVar16 + lVar32 * 8 + lVar38);
                          fVar46 = *(float *)((long)pvVar16 + lVar32 * 8 + lVar38 + 4);
                          *(ulong *)(*local_198 + lVar32 * 8 + local_158 * local_190) =
                               CONCAT44((float)((ulong)*(undefined8 *)
                                                        (*local_198 +
                                                        lVar32 * 8 + local_158 * local_190) >> 0x20)
                                        + fVar44 * fVar45 + fVar43 * fVar46,
                                        (float)*(undefined8 *)
                                                (*local_198 + lVar32 * 8 + local_158 * local_190) +
                                        fVar44 * fVar43 + -fVar45 * fVar46);
                          lVar32 = lVar32 + 1;
                        } while (lVar20 != lVar32);
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != lVar42 - lVar25);
                  }
                  local_190 = local_190 + 8;
                  lVar25 = local_170 + 1;
                } while (local_170 + 1 != lVar1);
              }
              break;
            case 0x3ef:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_138 = local_198;
                local_1e8 = local_198;
                local_190 = 0;
                lVar25 = lVar40;
                do {
                  local_170 = lVar25;
                  lVar25 = *(long *)(local_70 + (local_170 - lVar40) * 8);
                  lVar42 = *(long *)(local_70 + 8 + (local_170 - lVar40) * 8);
                  if (lVar25 < lVar42) {
                    lVar36 = 0;
                    do {
                      lVar32 = *(long *)(local_78 + lVar25 * 8 + lVar36 * 8);
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          pdVar33 = (double *)((long)pvVar16 + lVar32 * 0x10 + lVar18 * -0x10 + 8);
                          pauVar19 = local_1e8;
                          lVar32 = lVar20;
                          do {
                            pdVar35 = (double *)(local_90 + (lVar36 + lVar25) * 0x10);
                            dVar4 = *pdVar35;
                            dVar11 = pdVar35[1];
                            dVar3 = *(double *)(*pauVar19 + 8) +
                                    pdVar33[-1] * dVar11 + dVar4 * *pdVar33;
                            auVar10._8_4_ = SUB84(dVar3,0);
                            auVar10._0_8_ =
                                 *(double *)*pauVar19 + pdVar33[-1] * dVar4 + -dVar11 * *pdVar33;
                            auVar10._12_4_ = (int)((ulong)dVar3 >> 0x20);
                            *pauVar19 = auVar10;
                            pauVar19 = pauVar19 + local_158;
                            pdVar33 = pdVar33 + lVar20 * 2;
                            lVar32 = lVar32 + -1;
                          } while (lVar32 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar30 = (lVar32 - lVar18) * lVar20 * 0x10;
                        lVar38 = 0;
                        lVar32 = lVar20;
                        do {
                          pdVar33 = (double *)(local_90 + (lVar36 + lVar25) * 0x10);
                          dVar12 = *pdVar33;
                          dVar13 = pdVar33[1];
                          dVar3 = *(double *)((long)pvVar16 + lVar38 + lVar30);
                          dVar4 = *(double *)((long)pvVar16 + lVar38 + lVar30 + 8);
                          dVar11 = *(double *)
                                    ((long)(*local_198 + lVar38 + local_158 * local_190) + 8) +
                                   dVar3 * dVar13 + dVar12 * dVar4;
                          auVar9._8_4_ = SUB84(dVar11,0);
                          auVar9._0_8_ = *(double *)(*local_198 + lVar38 + local_158 * local_190) +
                                         dVar3 * dVar12 + -dVar13 * dVar4;
                          auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
                          *(undefined1 (*) [16])(*local_198 + lVar38 + local_158 * local_190) =
                               auVar9;
                          lVar38 = lVar38 + 0x10;
                          lVar32 = lVar32 + -1;
                        } while (lVar32 != 0);
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != lVar42 - lVar25);
                  }
                  local_190 = local_190 + 0x10;
                  local_1e8 = local_1e8 + 1;
                  lVar25 = local_170 + 1;
                } while (local_170 + 1 != lVar1);
              }
              break;
            case 0x3f8:
              if (lVar37 <= lVar1) {
                lVar20 = (local_168 - local_188) + 1;
                local_1b0 = 0;
                lVar25 = lVar40;
                do {
                  lVar42 = *(long *)(local_70 + (lVar25 - lVar40) * 8);
                  lVar36 = *(long *)(local_70 + 8 + (lVar25 - lVar40) * 8);
                  if (lVar42 < lVar36) {
                    lVar32 = local_90 + lVar42 * 8;
                    lVar38 = 0;
                    do {
                      lVar30 = *(long *)(local_78 + lVar42 * 8 + lVar38 * 8) - lVar18;
                      if (trans == 0) {
                        if (local_188 <= local_168) {
                          plVar28 = (long *)((long)pvVar16 + lVar30 * 8);
                          plVar24 = (long *)(*local_198 + local_1b0);
                          lVar30 = lVar20;
                          do {
                            *plVar24 = *plVar24 + *plVar28 * *(long *)(lVar32 + lVar38 * 8);
                            plVar24 = plVar24 + local_158;
                            plVar28 = plVar28 + lVar20;
                            lVar30 = lVar30 + -1;
                          } while (lVar30 != 0);
                        }
                      }
                      else if (local_188 <= local_168) {
                        lVar23 = 0;
                        do {
                          *(long *)(*local_198 + lVar23 * 8 + local_158 * local_1b0) =
                               *(long *)(*local_198 + lVar23 * 8 + local_158 * local_1b0) +
                               *(long *)((long)pvVar16 + lVar23 * 8 + lVar30 * lVar20 * 8) *
                               *(long *)(lVar32 + lVar38 * 8);
                          lVar23 = lVar23 + 1;
                        } while (lVar20 != lVar23);
                      }
                      lVar38 = lVar38 + 1;
                    } while (lVar38 != lVar36 - lVar42);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 8;
                } while (lVar25 != lVar1);
              }
            }
          }
          free(pvVar16);
          lVar18 = local_98 + 1;
          lVar25 = local_a8;
          p_Var41 = SPA;
          g_a = local_b0;
        } while (lVar18 < *(long *)((long)&SPA->nblocks + local_a8));
      }
      IVar15 = local_b8 + 1;
    } while (IVar15 != local_e0);
  }
  if ((int)local_140 != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar25));
  }
  return g_a;
}

Assistant:

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a, Integer g_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = s_a+GA_OFFSET;
  Integer hdl_b = g_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_a].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  Integer longidx;
  Integer type;
  Integer jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (SPA[hdl_a].type != GA[hdl_b].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_a].type;
  if (SPA[hdl_a].grp != GA[hdl_b].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_b].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be"
    " of dimension 2",GA[hdl_b].ndim);
  }
  if ((trans && SPA[hdl_a].jdim != GA[hdl_b].dims[1]) ||
      (!trans && SPA[hdl_a].jdim != GA[hdl_b].dims[0])) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_a].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_a].size;
  idim = SPA[hdl_a].idim;
  if (trans) {
    jdim = GA[hdl_b].dims[0];
  } else {
    jdim = GA[hdl_b].dims[1];
  }
  /* Construct product array C*/
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = SPA[hdl_a].ihi-SPA[hdl_a].ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_a].grp);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = SPA[hdl_a].ilo+1;
    hi_c[0] = SPA[hdl_a].ihi+1;
    pnga_sprs_array_column_distribution(s_a,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    /* loop over all sub-blocks in column and row block that contribute
     * to target block */
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over non-zero blocks in row in sparse matrix A */
    for (nn=0; nn<SPA[hdl_a].nblocks; nn++) {
      void *iptr_a, *jptr_a;
      Integer ilo_a, ihi_a, jlo_a, jhi_a;
      Integer lo_b[2], hi_b[2], ld_b[2];
      Integer tlo_b[2], thi_b[2];
      void *val_a;
      void *buf_b;
      Integer nelem;
      Integer ii,jlen;
      n = SPA[hdl_a].blkidx[nn];
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Find block of A for multiplication */
      ilo_a = lo_c[0]-1;
      ihi_a = hi_c[0]-1;
      pnga_sprs_array_column_distribution(s_a, n, &jlo_a, &jhi_a);
      /* get pointer to sparse block */
      pnga_sprs_array_access_col_block(s_a, n, &iptr_a, &jptr_a, &val_a);
      lo_b[0] = jlo_a+1;
      hi_b[0] = jhi_a+1;
      lo_b[1] = lo_c[1];
      hi_b[1] = hi_c[1];
      if (trans) {
        tlo_b[0] = lo_b[1];
        thi_b[0] = hi_b[1];
        tlo_b[1] = lo_b[0];
        thi_b[1] = hi_b[0];
      } else {
        tlo_b[0] = lo_b[0];
        thi_b[0] = hi_b[0];
        tlo_b[1] = lo_b[1];
        thi_b[1] = hi_b[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_b[0]-tlo_b[0]+1)*(thi_b[1]-tlo_b[1]+1);
      buf_b = malloc(nelem*SPA[hdl_a].size);
      ld_b[0] = (thi_b[0]-tlo_b[0]+1);
      ld_b[1] = (thi_b[1]-tlo_b[1]+1);
      pnga_get(g_b,tlo_b,thi_b,buf_b,ld_b);
      if (SPA[hdl_a].idx_size == 4) {
        int *idx_a = (int*)iptr_a;
        int *jdx_a = (int*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_a = (int64_t*)iptr_a;
        int64_t *jdx_a = (int64_t*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      }
      free(buf_b);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
  return g_c;
}